

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

void __thiscall cmLocalNinjaGenerator::WriteProjectHeader(cmLocalNinjaGenerator *this,ostream *os)

{
  ostream *poVar1;
  string_view separator;
  char local_59;
  string local_58;
  string local_38;
  
  cmGlobalNinjaGenerator::WriteDivider(os);
  std::__ostream_insert<char,std::char_traits<char>>(os,"# Project: ",0xb);
  cmLocalGenerator::GetProjectName_abi_cxx11_(&local_38,(cmLocalGenerator *)this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_38._M_dataplus._M_p,local_38._M_string_length);
  local_58._M_dataplus._M_p._0_1_ = 10;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"# Configurations: ",0x12);
  separator._M_str = ", ";
  separator._M_len = 2;
  cmJoin(&local_58,&(this->super_cmLocalCommonGenerator).ConfigNames,separator,
         (string_view)ZEXT816(0));
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                              local_58._M_dataplus._M_p._0_1_),
                      local_58._M_string_length);
  local_59 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_59,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) !=
      &local_58.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  cmGlobalNinjaGenerator::WriteDivider(os);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteProjectHeader(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Project: " << this->GetProjectName() << '\n'
     << "# Configurations: " << cmJoin(this->GetConfigNames(), ", ") << '\n';
  cmGlobalNinjaGenerator::WriteDivider(os);
}